

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O2

int Cec_GiaSplitTestInt(Gia_Man_t *p,int nProcs,int nTimeOut,int nIterMax,int LookAhead,int fVerbose
                       ,int fVeryVerbose,int fSilent)

{
  int iVar1;
  int iVar2;
  uint iVar;
  uint uVar3;
  uint uVar4;
  abctime aVar5;
  Cnf_Dat_t *pCVar6;
  abctime aVar7;
  Vec_Ptr_t *p_00;
  Gia_Man_t *pGVar8;
  Gia_Man_t *pGVar9;
  Vec_Int_t *pVVar10;
  abctime time;
  Par_ThData_t_conflict *pPVar11;
  int iVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  pthread_t *__newthread;
  bool bVar16;
  double dVar17;
  int local_135c;
  uint local_1358;
  uint local_1350;
  double local_1328;
  int Cost;
  int nFanouts;
  int nSatConfs;
  int nSatVars;
  Abc_Cex_t **local_1300;
  pthread_t WorkerThread [100];
  Par_ThData_t_conflict ThData [100];
  
  iVar2 = nProcs;
  aVar5 = Abc_Clock();
  local_1300 = &p->pCexComb;
  Abc_CexFreeP(local_1300);
  if (fVerbose != 0) {
    puts("Solving CEC problem by cofactoring with the following parameters:");
    iVar2 = nProcs;
    printf("Processes = %d   TimeOut = %d sec   MaxIter = %d   LookAhead = %d   Verbose = %d.\n",
           (ulong)(uint)nProcs,(ulong)(uint)nTimeOut,(ulong)(uint)nIterMax,(ulong)(uint)LookAhead,
           (ulong)(uint)fVerbose);
  }
  fflush(_stdout);
  if (nProcs == 1) {
    iVar2 = Cec_GiaSplitTest2(p,iVar2,nTimeOut,nIterMax,LookAhead,fVerbose,fVeryVerbose,fSilent);
    return iVar2;
  }
  if (99 < nProcs - 2U) {
    __assert_fail("nProcs >= 1 && nProcs <= PAR_THR_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSplit.c"
                  ,0x250,"int Cec_GiaSplitTestInt(Gia_Man_t *, int, int, int, int, int, int, int)");
  }
  pCVar6 = Cec_GiaDeriveGiaRemapped(p);
  iVar2 = Cnf_GiaSolveOne(p,pCVar6,nTimeOut,&nSatVars,&nSatConfs);
  Cnf_DataFree(pCVar6);
  iVar12 = (int)pCVar6;
  if (iVar2 != -1 && fVerbose != 0) {
    aVar7 = Abc_Clock();
    iVar12 = 0;
    Cec_GiaSplitPrint(0,0,nSatVars,nSatConfs,iVar2,0.0,aVar7 - aVar5);
  }
  if (iVar2 == -1) {
    p_00 = Vec_PtrAlloc(iVar12);
    pGVar8 = Gia_ManDup(p);
    Vec_PtrPush(p_00,pGVar8);
    uVar15 = 0;
    uVar14 = (ulong)(nProcs - 1U);
    if ((int)(nProcs - 1U) < 1) {
      uVar14 = uVar15;
    }
    __newthread = WorkerThread;
    pPVar11 = ThData;
    while (uVar14 != uVar15) {
      pPVar11->p = (Gia_Man_t *)0x0;
      pPVar11->pCnf = (Cnf_Dat_t *)0x0;
      pPVar11->iThread = (int)uVar15;
      pPVar11->nTimeOut = nTimeOut;
      pPVar11->fWorking = 0;
      pPVar11->Result = -1;
      pPVar11->nVars = -1;
      pPVar11->nConfs = -1;
      iVar2 = pthread_create(__newthread,(pthread_attr_t *)0x0,Cec_GiaSplitWorkerThread,pPVar11);
      uVar15 = uVar15 + 1;
      __newthread = __newthread + 1;
      pPVar11 = pPVar11 + 1;
      if (iVar2 != 0) {
        __assert_fail("status == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSplit.c"
                      ,0x272,
                      "int Cec_GiaSplitTestInt(Gia_Man_t *, int, int, int, int, int, int, int)");
      }
    }
    local_1328 = 0.0;
    local_1350 = 0;
    local_1358 = 1;
    bVar16 = true;
    do {
      if (!bVar16) goto LAB_0052d8ab;
      bVar16 = 0 < p_00->nSize;
      pPVar11 = ThData;
      for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
        if (pPVar11->fWorking == 0) {
          pGVar8 = pPVar11->p;
          if (pGVar8 != (Gia_Man_t *)0x0) {
            if (pGVar8->vCofVars == (Vec_Int_t *)0x0) {
              pVVar10 = Vec_IntAlloc(100);
              pGVar8->vCofVars = pVVar10;
              local_135c = 0;
            }
            else {
              local_135c = pGVar8->vCofVars->nSize;
            }
            if (fVerbose != 0) {
              iVar2 = pPVar11->Result;
              iVar12 = pPVar11->nVars;
              iVar1 = pPVar11->nConfs;
              aVar7 = Abc_Clock();
              Cec_GiaSplitPrint((int)uVar15 + 1,local_135c,iVar12,iVar1,iVar2,local_1328,
                                aVar7 - aVar5);
            }
            if (pPVar11->Result == -1) {
              iVar = Gia_SplitCofVar(pGVar8,LookAhead,&nFanouts,&Cost);
              pGVar9 = Gia_ManDupCofactorVar(pGVar8,iVar,0);
              pVVar10 = Vec_IntAlloc(pGVar8->vCofVars->nSize + 1);
              pGVar9->vCofVars = pVVar10;
              Vec_IntAppend(pVVar10,pGVar8->vCofVars);
              iVar2 = iVar * 2 + 1;
              Vec_IntPush(pGVar9->vCofVars,iVar2);
              Vec_PtrPush(p_00,pGVar9);
              iVar1 = nFanouts;
              iVar12 = Cost;
              if (fVeryVerbose != 0) {
                uVar3 = Gia_ManAndNum(pGVar8);
                uVar4 = Gia_ManAndNum(pGVar9);
                printf("Var = %5d. Fanouts = %5d. Cost = %8d.  AndBefore = %6d.  AndAfter = %6d.\n",
                       (ulong)iVar,(ulong)(uint)iVar1,(ulong)(uint)iVar12,(ulong)uVar3,(ulong)uVar4)
                ;
              }
              pGVar9 = Gia_ManDupCofactorVar(pGVar8,iVar,1);
              pVVar10 = Vec_IntAlloc(pGVar8->vCofVars->nSize + 1);
              pGVar9->vCofVars = pVVar10;
              Vec_IntAppend(pVVar10,pGVar8->vCofVars);
              Vec_IntPush(pGVar9->vCofVars,iVar2);
              Vec_PtrPush(p_00,pGVar9);
              local_1350 = local_1350 + 1;
              bVar16 = true;
            }
            else {
              if (pPVar11->Result == 0) {
                *local_1300 = pGVar8->pCexComb;
                pGVar8->pCexComb = (Abc_Cex_t *)0x0;
                local_1358 = 0;
                goto LAB_0052d8ab;
              }
              dVar17 = ldexp(1.0,local_135c);
              local_1328 = local_1328 + 1.0 / dVar17;
            }
            Gia_ManStopP(&pPVar11->p);
            if (pPVar11->pCnf == (Cnf_Dat_t *)0x0) goto LAB_0052d85a;
            Cnf_DataFree(pPVar11->pCnf);
            pPVar11->pCnf = (Cnf_Dat_t *)0x0;
          }
          if (p_00->nSize != 0) {
            if (pPVar11->p != (Gia_Man_t *)0x0) {
              __assert_fail("ThData[i].p == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSplit.c"
                            ,0x2b6,
                            "int Cec_GiaSplitTestInt(Gia_Man_t *, int, int, int, int, int, int, int)"
                           );
            }
            pGVar8 = (Gia_Man_t *)Vec_PtrPop(p_00);
            pPVar11->p = pGVar8;
            pCVar6 = Cec_GiaDeriveGiaRemapped(pGVar8);
            pPVar11->pCnf = pCVar6;
            pPVar11->fWorking = 1;
          }
        }
        else {
          bVar16 = true;
        }
LAB_0052d85a:
        pPVar11 = pPVar11 + 1;
      }
    } while ((nIterMax == 0) || ((int)local_1350 < nIterMax));
    local_1358 = -(uint)bVar16 | 1;
LAB_0052d8ab:
    pPVar11 = ThData;
    while (bVar16 = uVar14 != 0, uVar14 = uVar14 - 1, bVar16) {
      if (pPVar11->fWorking != 0) {
        __assert_fail("!ThData[i].fWorking",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSplit.c"
                      ,0x2c8,
                      "int Cec_GiaSplitTestInt(Gia_Man_t *, int, int, int, int, int, int, int)");
      }
      Gia_ManStopP(&pPVar11->p);
      if (pPVar11->pCnf != (Cnf_Dat_t *)0x0) {
        Cnf_DataFree(pPVar11->pCnf);
        pPVar11->p = (Gia_Man_t *)0x0;
        pPVar11->pCnf = (Cnf_Dat_t *)0x0;
        pPVar11->fWorking = 1;
      }
      pPVar11 = pPVar11 + 1;
    }
    Cec_GiaSplitClean(p_00);
    if (fSilent == 0) {
      printf((&PTR_anon_var_dwarf_5cfc8d_00a8b0a0)[(int)local_1358]);
      pcVar13 = (char *)(ulong)local_1350;
      printf("after %d case-splits.  ");
      aVar7 = Abc_Clock();
      Abc_PrintTime((int)aVar7 - (int)aVar5,pcVar13,time);
      fflush(_stdout);
    }
  }
  else {
    if (iVar2 == 1) {
      local_1358 = 1;
      if (fSilent != 0) {
        return 1;
      }
      pcVar13 = "The problem is UNSAT without cofactoring.";
    }
    else {
      local_1358 = 0;
      if (fSilent != 0) {
        return 0;
      }
      pcVar13 = "The problem is SAT without cofactoring.";
    }
    puts(pcVar13);
  }
  return local_1358;
}

Assistant:

int Cec_GiaSplitTestInt( Gia_Man_t * p, int nProcs, int nTimeOut, int nIterMax, int LookAhead, int fVerbose, int fVeryVerbose, int fSilent )
{
    abctime clkTotal = Abc_Clock();
    Par_ThData_t ThData[PAR_THR_MAX];
    pthread_t WorkerThread[PAR_THR_MAX];
    Vec_Ptr_t * vStack;
    Cnf_Dat_t * pCnf;
    double Progress = 0;
    int i, status, nSatVars, nSatConfs;
    int nIter = 0, RetValue = -1, fWorkToDo = 1;
    Abc_CexFreeP( &p->pCexComb );
    if ( fVerbose )
        printf( "Solving CEC problem by cofactoring with the following parameters:\n" );
    if ( fVerbose )
        printf( "Processes = %d   TimeOut = %d sec   MaxIter = %d   LookAhead = %d   Verbose = %d.\n", nProcs, nTimeOut, nIterMax, LookAhead, fVerbose );
    fflush( stdout );
    if ( nProcs == 1 )
        return Cec_GiaSplitTest2( p, nProcs, nTimeOut, nIterMax, LookAhead, fVerbose, fVeryVerbose, fSilent );
    // subtract manager thread
    nProcs--;
    assert( nProcs >= 1 && nProcs <= PAR_THR_MAX );
    // check the problem
    pCnf = Cec_GiaDeriveGiaRemapped( p );
    status = Cnf_GiaSolveOne( p, pCnf, nTimeOut, &nSatVars, &nSatConfs );
    Cnf_DataFree( pCnf );
    if ( fVerbose && status != -1 )
        Cec_GiaSplitPrint( 0, 0, nSatVars, nSatConfs, status, Progress, Abc_Clock() - clkTotal );
    if ( status == 0 )
    {
        if ( !fSilent )
        printf( "The problem is SAT without cofactoring.\n" );
        return 0;
    }
    if ( status == 1 )
    {
        if ( !fSilent )
        printf( "The problem is UNSAT without cofactoring.\n" );
        return 1;
    }
    assert( status == -1 );
    // create local copy
    vStack = Vec_PtrAlloc( 1000 );
    Vec_PtrPush( vStack, Gia_ManDup(p) );
    // start threads
    for ( i = 0; i < nProcs; i++ )
    {
        ThData[i].p        = NULL;
        ThData[i].pCnf     = NULL;
        ThData[i].iThread  = i;
        ThData[i].nTimeOut = nTimeOut;
        ThData[i].fWorking = 0;
        ThData[i].Result   = -1;
        ThData[i].nVars    = -1;
        ThData[i].nConfs   = -1;
        status = pthread_create( WorkerThread + i, NULL,Cec_GiaSplitWorkerThread, (void *)(ThData + i) );  assert( status == 0 );
    }
    // look at the threads
    while ( fWorkToDo )
    {
        fWorkToDo = (int)(Vec_PtrSize(vStack) > 0);
        for ( i = 0; i < nProcs; i++ )
        {
            // check if this thread is working
            if ( ThData[i].fWorking )
            {
                fWorkToDo = 1;
                continue;
            }
            // check if this thread has recently finished
            if ( ThData[i].p != NULL )
            {
                Gia_Man_t * pLast = ThData[i].p;
                int Depth = pLast->vCofVars ? Vec_IntSize(pLast->vCofVars) : 0;
                if ( pLast->vCofVars == NULL )
                    pLast->vCofVars = Vec_IntAlloc( 100 );
                if ( fVerbose )
                    Cec_GiaSplitPrint( i+1, Depth, ThData[i].nVars, ThData[i].nConfs, ThData[i].Result, Progress, Abc_Clock() - clkTotal );
                if ( ThData[i].Result == 0 ) // SAT
                {
                    p->pCexComb = pLast->pCexComb;  pLast->pCexComb = NULL;
                    RetValue = 0;
                    goto finish;
                }
                if ( ThData[i].Result == -1 ) // UNDEC
                {
                    // determine cofactoring variable
                    int nFanouts, Cost, iVar = Gia_SplitCofVar( pLast, LookAhead, &nFanouts, &Cost );
                    // cofactor
                    Gia_Man_t * pPart = Gia_ManDupCofactorVar( pLast, iVar, 0 );
                    pPart->vCofVars = Vec_IntAlloc( Vec_IntSize(pLast->vCofVars) + 1 );
                    Vec_IntAppend( pPart->vCofVars, pLast->vCofVars );
                    Vec_IntPush( pPart->vCofVars, Abc_Var2Lit(iVar, 1) );
                    Vec_PtrPush( vStack, pPart );
                    // print results
                    if ( fVeryVerbose )
                    {
//                        Cec_GiaSplitPrintRefs( pLast );
                        printf( "Var = %5d. Fanouts = %5d. Cost = %8d.  AndBefore = %6d.  AndAfter = %6d.\n", 
                            iVar, nFanouts, Cost, Gia_ManAndNum(pLast), Gia_ManAndNum(pPart) );
//                        Cec_GiaSplitPrintRefs( pPart );
                    }
                    // cofactor
                    pPart = Gia_ManDupCofactorVar( pLast, iVar, 1 );
                    pPart->vCofVars = Vec_IntAlloc( Vec_IntSize(pLast->vCofVars) + 1 );
                    Vec_IntAppend( pPart->vCofVars, pLast->vCofVars );
                    Vec_IntPush( pPart->vCofVars, Abc_Var2Lit(iVar, 1) );
                    Vec_PtrPush( vStack, pPart );
                    // keep working
                    fWorkToDo = 1;
                    nIter++;
                }
                else
                    Progress += 1.0 / pow((double)2, (double)Depth);
                Gia_ManStopP( &ThData[i].p );
                if ( ThData[i].pCnf == NULL )
                    continue;
                Cnf_DataFree( ThData[i].pCnf );
                ThData[i].pCnf = NULL;
            }
            if ( Vec_PtrSize(vStack) == 0 )
                continue;
            // start a new thread
            assert( ThData[i].p == NULL );
            ThData[i].p = (Gia_Man_t*)Vec_PtrPop( vStack );
            ThData[i].pCnf = Cec_GiaDeriveGiaRemapped( ThData[i].p );
            ThData[i].fWorking = 1;
        }
        if ( nIterMax && nIter >= nIterMax )
            break;
    }
    if ( !fWorkToDo )
        RetValue = 1;
finish:
    // wait till threads finish
    for ( i = 0; i < nProcs; i++ )
        if ( ThData[i].fWorking )
            i = 0;
    // stop threads
    for ( i = 0; i < nProcs; i++ )
    {
        assert( !ThData[i].fWorking );
        // cleanup
        Gia_ManStopP( &ThData[i].p );
        if ( ThData[i].pCnf == NULL )
            continue;
        Cnf_DataFree( ThData[i].pCnf );
        ThData[i].pCnf = NULL;
        // stop
        ThData[i].p = NULL;
        ThData[i].fWorking = 1;
    }
    // finish
    Cec_GiaSplitClean( vStack );
    if ( !fSilent )
    {
        if ( RetValue == 0 )
            printf( "Problem is SAT " );
        else if ( RetValue == 1 )
            printf( "Problem is UNSAT " );
        else if ( RetValue == -1 )
            printf( "Problem is UNDECIDED " );
        else assert( 0 );
        printf( "after %d case-splits.  ", nIter );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
        fflush( stdout );
    }
    return RetValue;
}